

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  byte bVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Type TVar8;
  int iVar9;
  TestEventListeners *this_00;
  TestEventListener *pTVar10;
  TimeInMillis TVar11;
  Random *this_01;
  UnitTestImpl *this_02;
  char *__s;
  TestSuite *pTVar12;
  undefined8 uVar13;
  bool local_28d;
  uint local_28c;
  char *local_280;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  string filter_warning;
  undefined1 local_1f8 [7];
  bool delete_environment_on_teardown;
  undefined1 local_1f0 [16];
  int test_index_1;
  int j_1;
  int test_index;
  int *local_1b8;
  string *result;
  TestPartResult *test_part_result;
  TestResult *pTStack_1a0;
  int j;
  TestResult *test_result;
  Timer timer;
  int i;
  bool recreate_environments_when_repeating;
  bool gtest_repeat_forever;
  int repeat;
  TestEventListener *repeater;
  bool failed;
  bool has_tests_to_run;
  bool should_shard;
  bool in_subprocess_for_death_test;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  byte local_d9;
  char local_d8 [7];
  bool fail_if_no_test_linked;
  char kNoTestLinkedWarning [35];
  char local_a8 [8];
  char kNoTestLinkedFatal [69];
  char local_58 [8];
  char kNoTestLinkedMessage [50];
  bool gtest_is_initialized_before_run_all_tests;
  UnitTestImpl *this_local;
  
  bVar3 = GTestIsInitialized();
  if ((g_help_flag & 1) == 0) {
    PostFlagParsingInit(this);
    iVar6 = total_test_count(this);
    if (iVar6 == 0) {
      memcpy(local_58,"This test program does NOT link in any test case.",0x32);
      memcpy(local_a8,"This is INVALID. Please make sure to link in at least one test case.",0x45);
      memcpy(local_d8,"Please make sure this is intended.",0x23);
      local_d9 = FLAGS_gtest_fail_if_no_test_linked & 1;
      if (local_d9 == 0) {
        local_280 = local_d8;
      }
      else {
        local_280 = local_a8;
      }
      ColoredPrintf(kRed,"%s %s\n",local_58,local_280);
      if ((local_d9 & 1) != 0) {
        return false;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,local_58,&local_161);
      std::operator+(&local_140,&local_160,' ');
      std::operator+(&local_120,&local_140,local_d8);
      std::operator+(&local_100,&local_120,'\n');
      AppendToTestWarningsOutputFile(&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator(&local_161);
    }
    WriteToShardStatusFileIfNeeded();
    bVar4 = std::operator!=(&this->internal_run_death_test_flag_,(nullptr_t)0x0);
    bVar5 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",bVar4);
    iVar6 = FilterTests(this,(uint)!bVar5);
    if ((FLAGS_gtest_list_tests & 1) == 0) {
      iVar7 = GetRandomSeedFromFlag(FLAGS_gtest_random_seed);
      this->random_seed_ = iVar7;
      bVar1 = 0;
      this_00 = listeners(this);
      pTVar10 = TestEventListeners::repeater(this_00);
      TVar11 = GetTimeInMillis();
      this->start_timestamp_ = TVar11;
      (*pTVar10->_vptr_TestEventListener[2])(pTVar10,this->parent_);
      if (bVar4) {
        local_28c = 1;
      }
      else {
        local_28c = FLAGS_gtest_repeat;
      }
      local_28d = (FLAGS_gtest_recreate_environments_when_repeating & 1) != 0 || (int)local_28c < 0;
      timer.start_.__d.__r._4_4_ = 0;
LAB_0031bda8:
      if ((int)local_28c < 0 || timer.start_.__d.__r._4_4_ != local_28c) {
        ClearNonAdHocTestResult(this);
        Timer::Timer((Timer *)&test_result);
        if ((0 < iVar6) && ((FLAGS_gtest_shuffle & 1) != 0)) {
          this_01 = (Random *)random(this);
          Random::Reseed(this_01,this->random_seed_);
          ShuffleTests(this);
        }
        (*pTVar10->_vptr_TestEventListener[3])
                  (pTVar10,this->parent_,(ulong)timer.start_.__d.__r._4_4_);
        if (0 < iVar6) {
          if ((timer.start_.__d.__r._4_4_ == 0) || (local_28d)) {
            (*pTVar10->_vptr_TestEventListener[4])(pTVar10,this->parent_);
            ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                      (&this->environments_,SetUpEnvironment);
            (*pTVar10->_vptr_TestEventListener[5])(pTVar10,this->parent_);
          }
          bVar4 = Test::IsSkipped();
          if (bVar4) {
            this_02 = GetUnitTestImpl();
            pTStack_1a0 = current_test_result(this_02);
            for (test_part_result._4_4_ = 0; iVar7 = test_part_result._4_4_,
                iVar9 = TestResult::total_part_count(pTStack_1a0), iVar7 < iVar9;
                test_part_result._4_4_ = test_part_result._4_4_ + 1) {
              result = (string *)TestResult::GetTestPartResult(pTStack_1a0,test_part_result._4_4_);
              TVar8 = TestPartResult::type((TestPartResult *)result);
              if (TVar8 == kSkip) {
                __s = TestPartResult::message((TestPartResult *)result);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&test_index,__s,(allocator<char> *)((long)&j_1 + 3));
                std::allocator<char>::~allocator((allocator<char> *)((long)&j_1 + 3));
                local_1b8 = &test_index;
                uVar13 = std::__cxx11::string::c_str();
                printf("%s\n",uVar13);
                std::__cxx11::string::~string((string *)&test_index);
              }
            }
            fflush(_stdout);
          }
          else {
            bVar4 = Test::HasFatalFailure();
            if (bVar4) {
              bVar4 = Test::HasFatalFailure();
              if (bVar4) {
                for (local_1f0._8_4_ = 0; uVar2 = local_1f0._8_4_,
                    iVar7 = total_test_suite_count(this), (int)uVar2 < iVar7;
                    local_1f0._8_4_ = local_1f0._8_4_ + 1) {
                  pTVar12 = GetMutableSuiteCase(this,local_1f0._8_4_);
                  TestSuite::Skip(pTVar12);
                }
              }
            }
            else {
              for (test_index_1 = 0; iVar7 = test_index_1, iVar9 = total_test_suite_count(this),
                  iVar7 < iVar9; test_index_1 = test_index_1 + 1) {
                pTVar12 = GetMutableSuiteCase(this,test_index_1);
                TestSuite::Run(pTVar12);
                if ((FLAGS_gtest_fail_fast & 1) != 0) {
                  pTVar12 = GetMutableSuiteCase(this,test_index_1);
                  bVar4 = TestSuite::Failed(pTVar12);
                  iVar7 = test_index_1;
                  if (bVar4) goto LAB_0031c0cb;
                }
              }
            }
          }
          goto LAB_0031c19e;
        }
        goto LAB_0031c23a;
      }
      (*pTVar10->_vptr_TestEventListener[0x11])(pTVar10,this->parent_);
      filter_warning.field_2._M_local_buf[0xf] = '\x01';
      ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                (&this->environments_,Delete<testing::Environment>);
      std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::clear
                (&this->environments_);
      bVar4 = ShouldWarnIfNoTestsMatchFilter(this);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"filter \"",&local_261);
        std::operator+(&local_240,&local_260,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       FLAGS_gtest_filter_abi_cxx11_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_220,&local_240,"\" did not match any test; no tests were run\n");
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator(&local_261);
        uVar13 = std::__cxx11::string::c_str();
        ColoredPrintf(kRed,"WARNING: %s",uVar13);
        AppendToTestWarningsOutputFile((string *)local_220);
        std::__cxx11::string::~string((string *)local_220);
      }
      if (!bVar3) {
        ColoredPrintf(kRed,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
      this_local._7_1_ = (bool)(bVar1 ^ 1);
    }
    else {
      ListTestsMatchingFilter(this);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
LAB_0031c0cb:
  while( true ) {
    local_1f0._12_4_ = iVar7 + 1;
    uVar2 = local_1f0._12_4_;
    iVar7 = total_test_suite_count(this);
    if (iVar7 <= (int)uVar2) break;
    pTVar12 = GetMutableSuiteCase(this,local_1f0._12_4_);
    TestSuite::Skip(pTVar12);
    iVar7 = local_1f0._12_4_;
  }
LAB_0031c19e:
  if ((timer.start_.__d.__r._4_4_ == local_28c - 1) || (local_28d)) {
    (*pTVar10->_vptr_TestEventListener[0xe])(pTVar10,this->parent_);
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rbegin
              ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)local_1f0)
    ;
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rend
              ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)local_1f8)
    ;
    __std__for_each<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>,void(*)(testing::Environment*)>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_void____testing__Environment____
              ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
                *)local_1f0,
               (reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
                *)local_1f8,TearDownEnvironment);
    (*pTVar10->_vptr_TestEventListener[0xf])(pTVar10,this->parent_);
  }
LAB_0031c23a:
  TVar11 = Timer::Elapsed((Timer *)&test_result);
  this->elapsed_time_ = TVar11;
  (*pTVar10->_vptr_TestEventListener[0x10])(pTVar10,this->parent_,(ulong)timer.start_.__d.__r._4_4_)
  ;
  bVar4 = Passed(this);
  if (!bVar4) {
    bVar1 = 1;
  }
  UnshuffleTests(this);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    iVar7 = GetNextRandomSeed(this->random_seed_);
    this->random_seed_ = iVar7;
  }
  timer.start_.__d.__r._4_4_ = timer.start_.__d.__r._4_4_ + 1;
  goto LAB_0031bda8;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag) return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Handle the case where the program has no tests linked.
  // Sometimes this is a programmer mistake, but sometimes it is intended.
  if (total_test_count() == 0) {
    constexpr char kNoTestLinkedMessage[] =
        "This test program does NOT link in any test case.";
    constexpr char kNoTestLinkedFatal[] =
        "This is INVALID. Please make sure to link in at least one test case.";
    constexpr char kNoTestLinkedWarning[] =
        "Please make sure this is intended.";
    const bool fail_if_no_test_linked = GTEST_FLAG_GET(fail_if_no_test_linked);
    ColoredPrintf(
        GTestColor::kRed, "%s %s\n", kNoTestLinkedMessage,
        fail_if_no_test_linked ? kNoTestLinkedFatal : kNoTestLinkedWarning);
    if (fail_if_no_test_linked) {
      return false;
    }
#if GTEST_HAS_FILE_SYSTEM
    AppendToTestWarningsOutputFile(std::string(kNoTestLinkedMessage) + ' ' +
                                   kNoTestLinkedWarning + '\n');
#endif  // GTEST_HAS_FILE_SYSTEM
  }

#if GTEST_HAS_FILE_SYSTEM
  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();
#endif  // GTEST_HAS_FILE_SYSTEM

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#ifdef GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_ != nullptr);
#if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
#endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run =
      FilterTests(should_shard ? HONOR_SHARDING_PROTOCOL
                               : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG_GET(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GetRandomSeedFromFlag(GTEST_FLAG_GET(random_seed));

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG_GET(repeat);

  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;

  // Should test environments be set up and torn down for each repeat, or only
  // set up on the first and torn down on the last iteration? If there is no
  // "last" iteration because the tests will repeat forever, always recreate the
  // environments to avoid leaks in case one of the environments is using
  // resources that are external to this process. Without this check there would
  // be no way to clean up those external resources automatically.
  const bool recreate_environments_when_repeating =
      GTEST_FLAG_GET(recreate_environments_when_repeating) ||
      gtest_repeat_forever;

  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    Timer timer;

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG_GET(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand. If test environments aren't
      // recreated for each iteration, only do so on the first iteration.
      if (i == 0 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsSetUpStart(*parent_);
        ForEach(environments_, SetUpEnvironment);
        repeater->OnEnvironmentsSetUpEnd(*parent_);
      }

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG_GET(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      } else if (Test::HasFatalFailure()) {
        // If there was a fatal failure during the global setup then we know we
        // aren't going to run any tests. Explicitly mark all of the tests as
        // skipped to make this obvious in the output.
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Skip();
        }
      }

      // Tears down all environments in reverse order afterwards. If test
      // environments aren't recreated for each iteration, only do so on the
      // last iteration.
      if (i == repeat - 1 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsTearDownStart(*parent_);
        std::for_each(environments_.rbegin(), environments_.rend(),
                      TearDownEnvironment);
        repeater->OnEnvironmentsTearDownEnd(*parent_);
      }
    }

    elapsed_time_ = timer.Elapsed();

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG_GET(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);
  // Destroy environments in normal code, not in static teardown.
  bool delete_environment_on_teardown = true;
  if (delete_environment_on_teardown) {
    ForEach(environments_, internal::Delete<Environment>);
    environments_.clear();
  }

  // Try to warn the user if no tests matched the test filter.
  if (ShouldWarnIfNoTestsMatchFilter()) {
    const std::string filter_warning =
        std::string("filter \"") + GTEST_FLAG_GET(filter) +
        "\" did not match any test; no tests were run\n";
    ColoredPrintf(GTestColor::kRed, "WARNING: %s", filter_warning.c_str());
#if GTEST_HAS_FILE_SYSTEM
    AppendToTestWarningsOutputFile(filter_warning);
#endif  // GTEST_HAS_FILE_SYSTEM
  }

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
  }

  return !failed;
}